

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O3

void __thiscall
chrono::ChArchiveIn::in<chrono::ChBezierCurve>
          (ChArchiveIn *this,ChNameValue<std::shared_ptr<chrono::ChBezierCurve>_> *bVal)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChBezierCurve *pCVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long lVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  shared_ptr<chrono::ChBezierCurve> *psVar7;
  _Hashtable<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  ChBezierCurve *mptr;
  ChFunctorArchiveInSpecificPtr<chrono::ChBezierCurve> specFuncA;
  ChBezierCurve *local_70;
  ChBezierCurve *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  undefined **local_40;
  ChBezierCurve **local_38;
  char *local_30;
  undefined ***local_28;
  char local_20;
  
  local_28 = &local_40;
  local_38 = &local_70;
  local_40 = &PTR__ChFunctorArchiveIn_00b3df40;
  local_30 = bVal->_name;
  local_20 = bVal->_flags;
  lVar4 = (**(code **)(*(long *)this + 0x68))();
  if (lVar4 == 0) {
    this_00 = (_Hashtable<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)(this + 200);
    local_68 = local_70;
    iVar5 = std::
            _Hashtable<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(this_00,&local_68);
    if (iVar5.super__Node_iterator_base<std::pair<void_*const,_std::shared_ptr<void>_>,_false>.
        _M_cur == (__node_type *)0x0) {
      local_68 = local_70;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBezierCurve*>
                (&_Stack_60,local_70);
      _Var3._M_pi = _Stack_60._M_pi;
      pCVar2 = local_68;
      psVar7 = bVal->_value;
      local_68 = (ChBezierCurve *)0x0;
      _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (psVar7->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      (psVar7->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           pCVar2;
      (psVar7->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
      _M_pi = _Var3._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
      }
      psVar7 = bVal->_value;
      local_58 = (psVar7->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
      p_Stack_50 = (psVar7->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
      p_Var1 = (psVar7->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      local_68 = local_70;
      psVar7 = (shared_ptr<chrono::ChBezierCurve> *)
               std::__detail::
               _Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_68);
      peVar8 = local_58;
      p_Var9 = p_Stack_50;
    }
    else {
      local_68 = local_70;
      pmVar6 = std::__detail::
               _Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_68);
      peVar8 = (element_type *)(pmVar6->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var9 = (pmVar6->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      p_Var1 = (pmVar6->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      psVar7 = bVal->_value;
    }
  }
  else {
    local_68 = local_70;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBezierCurve*>
              (&_Stack_60,local_70);
    _Var3._M_pi = _Stack_60._M_pi;
    pCVar2 = local_68;
    psVar7 = bVal->_value;
    local_68 = (ChBezierCurve *)0x0;
    _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (psVar7->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    (psVar7->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pCVar2;
    (psVar7->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
    _M_pi = _Var3._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
    }
    psVar7 = bVal->_value;
    local_58 = (psVar7->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
    p_Stack_50 = (psVar7->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
    p_Var1 = (psVar7->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    local_68 = local_70;
    psVar7 = (shared_ptr<chrono::ChBezierCurve> *)
             std::__detail::
             _Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::shared_ptr<void>_>,_std::allocator<std::pair<void_*const,_std::shared_ptr<void>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)(this + 200),&local_68);
    peVar8 = local_58;
    p_Var9 = p_Stack_50;
  }
  p_Var1 = (psVar7->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (psVar7->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar8;
  (psVar7->super___shared_ptr<chrono::ChBezierCurve,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
       = p_Var9;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  return;
}

Assistant:

void in     (ChNameValue< std::shared_ptr<T> > bVal) {
          T* mptr;
          ChFunctorArchiveInSpecificPtr<T> specFuncA(&mptr);
          ChNameValue<ChFunctorArchiveIn> mtmp(bVal.name(), specFuncA, bVal.flags());
          void* newptr = this->in_ref(mtmp);

          // Some additional complication respect to raw pointers: 
          // it must properly increment shared count of shared pointers.
          if(newptr) {
              // case A: new object, so just make a shared ptr with initial count=1
              bVal.value() = std::shared_ptr<T> ( mptr ); 
              this->shared_ptr_map[mptr] = std::static_pointer_cast<void>(bVal.value());
          }
          else {
              if (this->shared_ptr_map.find(mptr) != this->shared_ptr_map.end()) {
                  // case B1: preexisting object, previously referenced by a shared ptr, so increment ref count
                  bVal.value() = std::static_pointer_cast<T>(shared_ptr_map[mptr]);
              }
              else {
                  // case B2: preexisting object, but not referenced by shared ptr (maybe by some raw ptr) so just make a shared ptr with initial count=1
                  bVal.value() = std::shared_ptr<T> ( mptr ); 
                  this->shared_ptr_map[mptr] = std::static_pointer_cast<void>(bVal.value());
              }
          }
      }